

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O3

optional<CPubKey> * __thiscall
(anonymous_namespace)::KeyConverter::
FromPKHBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (optional<CPubKey> *__return_storage_ptr__,void *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last)

{
  mapped_type *__src;
  long in_FS_OFFSET;
  CKeyID keyid;
  key_type local_28;
  optional<CPubKey> *local_10;
  
  local_10 = *(optional<CPubKey> **)(in_FS_OFFSET + 0x28);
  if ((long)first._M_current - (long)this != 0x14) {
    __assert_fail("last - first == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miniscript_tests.cpp"
                  ,0xb9,
                  "std::optional<Key> (anonymous namespace)::KeyConverter::FromPKHBytes(I, I) const [I = __gnu_cxx::__normal_iterator<unsigned char *, std::vector<unsigned char>>]"
                 );
  }
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_28.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  if (first._M_current != (uchar *)this) {
    local_28.super_uint160.super_base_blob<160U>.m_data._M_elems._16_4_ =
         *(undefined4 *)((long)this + 0x10);
    local_28.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ = *this;
    local_28.super_uint160.super_base_blob<160U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((long)this + 8);
  }
  __src = std::
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          ::at((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                *)(g_testdata + 0x48),&local_28);
  memcpy(__return_storage_ptr__,__src,0x41);
  (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
  super__Optional_payload_base<CPubKey>._M_engaged = true;
  if (*(optional<CPubKey> **)(in_FS_OFFSET + 0x28) == local_10) {
    return *(optional<CPubKey> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKHBytes(I first, I last) const {
        assert(last - first == 20);
        CKeyID keyid;
        std::copy(first, last, keyid.begin());
        return g_testdata->pkmap.at(keyid);
    }